

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue> * __thiscall
llvm::AppleAcceleratorTable::Entry::lookup
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,Entry *this,AtomType Atom)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  pair<unsigned_short,_llvm::dwarf::Form> *ppVar4;
  DWARFFormValue *y;
  zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
  local_68;
  zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
  *local_58;
  value_type *Tuple;
  iterator __end1;
  iterator __begin1;
  zippy<llvm::detail::zip_first,_const_llvm::SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>_&,_const_llvm::SmallVector<llvm::DWARFFormValue,_3U>_&>
  *__range1;
  AtomType Atom_local;
  Entry *this_local;
  
  if (this->HdrData == (HeaderData *)0x0) {
    __assert_fail("HdrData && \"Dereferencing end iterator?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x116,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->HdrData->Atoms);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)&(this->super_Entry).Values);
  if (sVar2 == sVar3) {
    zip_first<llvm::SmallVector<std::pair<unsigned_short,llvm::dwarf::Form>,3u>const&,llvm::SmallVector<llvm::DWARFFormValue,3u>const&>
              ((llvm *)&__begin1.
                        super_zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                        .iterators.
                        super__Tuple_impl<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                        .
                        super__Head_base<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_false>
               ,&this->HdrData->Atoms,&(this->super_Entry).Values);
    detail::
    zippy<llvm::detail::zip_first,_const_llvm::SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>_&,_const_llvm::SmallVector<llvm::DWARFFormValue,_3U>_&>
    ::begin((zippy<llvm::detail::zip_first,_const_llvm::SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>_&,_const_llvm::SmallVector<llvm::DWARFFormValue,_3U>_&>
             *)&__end1.
                super_zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                .iterators.
                super__Tuple_impl<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                .super__Head_base<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_false>)
    ;
    detail::
    zippy<llvm::detail::zip_first,_const_llvm::SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>_&,_const_llvm::SmallVector<llvm::DWARFFormValue,_3U>_&>
    ::end((zippy<llvm::detail::zip_first,_const_llvm::SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>_&,_const_llvm::SmallVector<llvm::DWARFFormValue,_3U>_&>
           *)&Tuple);
    while( true ) {
      bVar1 = iterator_facade_base<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_std::bidirectional_iterator_tag,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>,_long,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>_*,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>_>
              ::operator!=((iterator_facade_base<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_std::bidirectional_iterator_tag,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>,_long,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>_*,_std::tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>_>
                            *)&__end1.
                               super_zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                               .iterators.
                               super__Tuple_impl<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                               .
                               super__Head_base<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_false>
                           ,(zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                             *)&Tuple);
      if (!bVar1) {
        Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
        return __return_storage_ptr__;
      }
      detail::
      zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
      ::operator*(&local_68);
      local_58 = &local_68;
      ppVar4 = std::
               get<0ul,std::pair<unsigned_short,llvm::dwarf::Form>const&,llvm::DWARFFormValue_const&>
                         ((tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>
                           *)local_58);
      if (ppVar4->first == Atom) break;
      detail::
      zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
      ::operator++((zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                    *)&__end1.
                       super_zip_common<llvm::detail::zip_first<const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                       .iterators.
                       super__Tuple_impl<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_const_llvm::DWARFFormValue_*>
                       .
                       super__Head_base<0UL,_const_std::pair<unsigned_short,_llvm::dwarf::Form>_*,_false>
                  );
    }
    y = std::get<1ul,std::pair<unsigned_short,llvm::dwarf::Form>const&,llvm::DWARFFormValue_const&>
                  ((tuple<const_std::pair<unsigned_short,_llvm::dwarf::Form>_&,_const_llvm::DWARFFormValue_&>
                    *)local_58);
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,y);
    return __return_storage_ptr__;
  }
  __assert_fail("HdrData->Atoms.size() == Values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                ,0x117,
                "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
               );
}

Assistant:

Optional<DWARFFormValue>
AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType Atom) const {
  assert(HdrData && "Dereferencing end iterator?");
  assert(HdrData->Atoms.size() == Values.size());
  for (const auto &Tuple : zip_first(HdrData->Atoms, Values)) {
    if (std::get<0>(Tuple).first == Atom)
      return std::get<1>(Tuple);
  }
  return None;
}